

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

int __thiscall re2::Compiler::AddSuffixRecursive(Compiler *this,int root,int id)

{
  bool bVar1;
  int iVar2;
  Frag a;
  Inst *pIVar3;
  Inst *pIVar4;
  undefined4 in_EDX;
  int in_ESI;
  Compiler *in_RDI;
  int out;
  int byterange;
  int br;
  int alt;
  Frag f;
  int in_stack_00000160;
  int in_stack_00000164;
  Compiler *in_stack_00000168;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  uint32_t in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  int out_00;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffbc;
  int local_4;
  
  out_00 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  a = FindByteRange(in_stack_00000168,in_stack_00000164,in_stack_00000160);
  bVar1 = IsNoMatch(a);
  if (bVar1) {
    local_4 = AllocInst((Compiler *)CONCAT44(in_ESI,in_EDX),a.end.p.p);
    if (local_4 < 0) {
      local_4 = 0;
    }
    else {
      PODArray<re2::Prog::Inst>::operator[]
                ((PODArray<re2::Prog::Inst> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
      Prog::Inst::InitAlt((Inst *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    }
  }
  else {
    if (a.end.p.p != 0) {
      if (((ulong)a & 0x100000000) == 0) {
        pIVar4 = PODArray<re2::Prog::Inst>::operator[]
                           ((PODArray<re2::Prog::Inst> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c);
        Prog::Inst::out(pIVar4);
      }
      else {
        pIVar4 = PODArray<re2::Prog::Inst>::operator[]
                           ((PODArray<re2::Prog::Inst> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c);
        Prog::Inst::out1(pIVar4);
      }
    }
    bVar1 = IsCachedRuneByteSuffix(in_RDI,in_stack_ffffffffffffffbc);
    local_4 = in_ESI;
    if (bVar1) {
      local_4 = AllocInst((Compiler *)CONCAT44(in_ESI,in_EDX),a.end.p.p);
      if (local_4 < 0) {
        return 0;
      }
      pIVar4 = PODArray<re2::Prog::Inst>::operator[]
                         ((PODArray<re2::Prog::Inst> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c);
      pIVar3 = PODArray<re2::Prog::Inst>::operator[]
                         ((PODArray<re2::Prog::Inst> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c);
      in_stack_ffffffffffffffb4 = Prog::Inst::lo(pIVar3);
      pIVar3 = PODArray<re2::Prog::Inst>::operator[]
                         ((PODArray<re2::Prog::Inst> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c);
      Prog::Inst::hi(pIVar3);
      pIVar3 = PODArray<re2::Prog::Inst>::operator[]
                         ((PODArray<re2::Prog::Inst> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c);
      in_stack_ffffffffffffffbc = Prog::Inst::foldcase(pIVar3);
      pIVar3 = PODArray<re2::Prog::Inst>::operator[]
                         ((PODArray<re2::Prog::Inst> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c);
      Prog::Inst::out(pIVar3);
      Prog::Inst::InitByteRange
                ((Inst *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (int)((ulong)pIVar4 >> 0x20),(int)pIVar4,in_stack_ffffffffffffffa4,
                 in_stack_ffffffffffffffa0);
      out_00 = (int)((ulong)pIVar4 >> 0x20);
      if (a.end.p.p != 0) {
        if (((ulong)a & 0x100000000) == 0) {
          PODArray<re2::Prog::Inst>::operator[]
                    ((PODArray<re2::Prog::Inst> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c);
          Prog::Inst::set_out((Inst *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              out_00);
          local_4 = in_ESI;
        }
        else {
          pIVar4 = PODArray<re2::Prog::Inst>::operator[]
                             ((PODArray<re2::Prog::Inst> *)
                              CONCAT44(local_4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c)
          ;
          (pIVar4->field_1).cap_ = local_4;
          in_stack_ffffffffffffffa4 = local_4;
          local_4 = in_ESI;
        }
      }
    }
    pIVar4 = PODArray<re2::Prog::Inst>::operator[]
                       ((PODArray<re2::Prog::Inst> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
    Prog::Inst::out(pIVar4);
    bVar1 = IsCachedRuneByteSuffix(in_RDI,in_stack_ffffffffffffffbc);
    if (!bVar1) {
      pIVar4 = PODArray<re2::Prog::Inst>::operator[]
                         ((PODArray<re2::Prog::Inst> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c);
      pIVar4->out_opcode_ = 0;
      pIVar4 = PODArray<re2::Prog::Inst>::operator[]
                         ((PODArray<re2::Prog::Inst> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c);
      (pIVar4->field_1).out1_ = 0;
      in_RDI->ninst_ = in_RDI->ninst_ + -1;
    }
    pIVar4 = PODArray<re2::Prog::Inst>::operator[]
                       ((PODArray<re2::Prog::Inst> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
    Prog::Inst::out(pIVar4);
    iVar2 = AddSuffixRecursive((Compiler *)CONCAT44(local_4,in_EDX),a.end.p.p,a.begin);
    if (iVar2 == 0) {
      local_4 = 0;
    }
    else {
      PODArray<re2::Prog::Inst>::operator[]
                ((PODArray<re2::Prog::Inst> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
      Prog::Inst::set_out((Inst *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          out_00);
    }
  }
  return local_4;
}

Assistant:

int Compiler::AddSuffixRecursive(int root, int id) {
  DCHECK(inst_[root].opcode() == kInstAlt ||
         inst_[root].opcode() == kInstByteRange);

  Frag f = FindByteRange(root, id);
  if (IsNoMatch(f)) {
    int alt = AllocInst(1);
    if (alt < 0)
      return 0;
    inst_[alt].InitAlt(root, id);
    return alt;
  }

  int br;
  if (f.end.p == 0)
    br = root;
  else if (f.end.p&1)
    br = inst_[f.begin].out1();
  else
    br = inst_[f.begin].out();

  if (IsCachedRuneByteSuffix(br)) {
    // We can't fiddle with cached suffixes, so make a clone of the head.
    int byterange = AllocInst(1);
    if (byterange < 0)
      return 0;
    inst_[byterange].InitByteRange(inst_[br].lo(), inst_[br].hi(),
                                   inst_[br].foldcase(), inst_[br].out());

    // Ensure that the parent points to the clone, not to the original.
    // Note that this could leave the head unreachable except via the cache.
    br = byterange;
    if (f.end.p == 0)
      root = br;
    else if (f.end.p&1)
      inst_[f.begin].out1_ = br;
    else
      inst_[f.begin].set_out(br);
  }

  int out = inst_[id].out();
  if (!IsCachedRuneByteSuffix(id)) {
    // The head should be the instruction most recently allocated, so free it
    // instead of leaving it unreachable.
    DCHECK_EQ(id, ninst_-1);
    inst_[id].out_opcode_ = 0;
    inst_[id].out1_ = 0;
    ninst_--;
  }

  out = AddSuffixRecursive(inst_[br].out(), out);
  if (out == 0)
    return 0;

  inst_[br].set_out(out);
  return root;
}